

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>::Setup
          (TextbookBoyerMooreWithLinearMap<char16_t> *this,ArenaAllocator *allocator,
          TextbookBoyerMooreSetup<char16_t> *setup)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  int32 *piVar5;
  ulong uVar6;
  
  if (setup->scheme != LinearScheme) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0x117,"(setup.GetScheme() == TextbookBoyerMooreSetup<C>::LinearScheme)",
                       "setup.GetScheme() == TextbookBoyerMooreSetup<C>::LinearScheme");
    if (!bVar2) goto LAB_00f19a56;
    *puVar3 = 0;
  }
  uVar6 = (ulong)setup->numLinearChars;
  if (4 < uVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharMap.h"
                       ,0x49,"(numLinearChars <= MaxCharMapLinearChars)",
                       "numLinearChars <= MaxCharMapLinearChars");
    if (!bVar2) {
LAB_00f19a56:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (uVar6 != 0) {
    uVar4 = 0;
    do {
      (this->lastOccurrence).map[uVar4] = (uint)(ushort)setup->linearChar[uVar4];
      (this->lastOccurrence).lastOcc[uVar4] = setup->lastOcc[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar6 != uVar4);
  }
  piVar5 = TextbookBoyerMooreSetup<char16_t>::GetGoodSuffix(allocator,setup->pat,setup->patLen,1);
  this->goodSuffix = piVar5;
  return;
}

Assistant:

void TextbookBoyerMooreWithLinearMap<C>::Setup(ArenaAllocator * allocator, TextbookBoyerMooreSetup<C> const& setup)
    {
        Assert(setup.GetScheme() == TextbookBoyerMooreSetup<C>::LinearScheme);
        lastOccurrence.Set(setup.numLinearChars, setup.linearChar, setup.lastOcc);
        goodSuffix = TextbookBoyerMooreSetup<C>::GetGoodSuffix(allocator, setup.pat, setup.patLen);
    }